

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_adaptive_quantize_avx2.c
# Opt level: O3

void aom_highbd_quantize_b_adaptive_avx2
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan)

{
  short sVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  short *psVar38;
  ulong uVar39;
  ushort uVar40;
  uint uVar41;
  uint uVar42;
  int iVar43;
  bool bVar44;
  long lVar45;
  uint *puVar46;
  long lVar47;
  undefined1 auVar48 [32];
  undefined1 auVar49 [64];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [64];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 in_ZMM13 [64];
  undefined1 auVar65 [32];
  uint local_140;
  uint local_13c [17];
  undefined1 local_f8 [32];
  
  lVar47 = 0;
  puVar46 = local_13c;
  bVar37 = true;
  do {
    bVar44 = bVar37;
    *puVar46 = ((dequant_ptr[lVar47] * 0x145 + 0x40 >> 7) + zbin_ptr[lVar47] * 0x20) - 1;
    lVar47 = 1;
    puVar46 = &local_140;
    bVar37 = false;
  } while (bVar44);
  auVar48._4_4_ = local_140;
  auVar48._0_4_ = local_140;
  auVar48._8_4_ = local_140;
  auVar48._12_4_ = local_140;
  auVar48._16_4_ = local_140;
  auVar48._20_4_ = local_140;
  auVar48._24_4_ = local_140;
  auVar48._28_4_ = local_140;
  auVar64 = vpmovsxwd_avx2(*(undefined1 (*) [16])zbin_ptr);
  auVar59 = vpblendd_avx2(auVar48,ZEXT432(local_13c[0]),1);
  auVar58 = vpcmpeqd_avx2(in_ZMM13._0_32_,in_ZMM13._0_32_);
  auVar52 = vpaddd_avx2(auVar58,auVar64);
  auVar51 = vpabsd_avx2(*(undefined1 (*) [32])coeff_ptr);
  auVar62 = vpabsd_avx2(*(undefined1 (*) [32])(coeff_ptr + 8));
  auVar55 = vpslld_avx2(auVar51,5);
  auVar59 = vpcmpgtd_avx2(auVar55,auVar59);
  auVar55 = vpslld_avx2(auVar62,5);
  auVar55 = vpcmpgtd_avx2(auVar55,auVar48);
  auVar59 = vpackssdw_avx2(auVar59,auVar55);
  auVar61 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
  auVar55 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
  bVar34 = (auVar59 >> 7 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar35 = (auVar59 >> 0xf & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar33 = (auVar59 >> 0x17 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar32 = (auVar59 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar31 = (auVar59 >> 0x27 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar30 = (auVar59 >> 0x2f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar29 = (auVar59 >> 0x37 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar28 = (auVar59 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar27 = (auVar59 >> 0x47 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar26 = (auVar59 >> 0x4f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar25 = (auVar59 >> 0x57 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar24 = (auVar59 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar23 = (auVar59 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar22 = (auVar59 >> 0x6f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar21 = (auVar59 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar20 = SUB321(auVar59 >> 0x7f,0) != '\0';
  bVar19 = (auVar59 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar18 = (auVar59 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar17 = (auVar59 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar16 = (auVar59 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar15 = (auVar59 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar14 = (auVar59 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar13 = (auVar59 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar12 = SUB321(auVar59 >> 0xbf,0) != '\0';
  bVar11 = (auVar59 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar10 = (auVar59 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar9 = (auVar59 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar8 = (auVar59 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar7 = (auVar59 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar6 = (auVar59 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar44 = (auVar59 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar37 = auVar59[0x1f] < '\0';
  if (((((((((((((((((((((((((((((((bVar34 || bVar35) || bVar33) || bVar32) || bVar31) || bVar30) ||
                              bVar29) || bVar28) || bVar27) || bVar26) || bVar25) || bVar24) ||
                        bVar23) || bVar22) || bVar21) || bVar20) || bVar19) || bVar18) || bVar17) ||
                 bVar16) || bVar15) || bVar14) || bVar13) || bVar12) || bVar11) || bVar10) || bVar9)
         || bVar8) || bVar7) || bVar6) || bVar44) || bVar37) {
    auVar59 = vpermq_avx2(auVar59,0xd8);
    auVar55 = vpand_avx2(auVar59,*(undefined1 (*) [32])iscan);
  }
  bVar37 = ((((((((((((((((((((((((((((((bVar34 || bVar35) || bVar33) || bVar32) || bVar31) ||
                                    bVar30) || bVar29) || bVar28) || bVar27) || bVar26) || bVar25)
                              || bVar24) || bVar23) || bVar22) || bVar21) || bVar20) || bVar19) ||
                        bVar18) || bVar17) || bVar16) || bVar15) || bVar14) || bVar13) || bVar12) ||
                 bVar11) || bVar10) || bVar9) || bVar8) || bVar7) || bVar6) || bVar44) || bVar37;
  auVar3 = vpmovsxwd_avx2(*(undefined1 (*) [16])round_ptr);
  auVar65 = vpmovsxwd_avx2(*(undefined1 (*) [16])quant_ptr);
  auVar4 = vpmovsxwd_avx2(*(undefined1 (*) [16])dequant_ptr);
  auVar56 = vpmovsxwd_avx2(*(undefined1 (*) [16])quant_shift_ptr);
  auVar64 = vpcmpgtd_avx2(auVar64,auVar51);
  auVar5 = vpshufd_avx2(auVar52,0xee);
  auVar52 = vpcmpgtd_avx2(auVar62,auVar5);
  auVar59 = vpackssdw_avx2(auVar64 ^ auVar58,auVar52);
  bVar35 = (auVar59 >> 7 & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar36 = (auVar59 >> 0xf & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar34 = (auVar59 >> 0x17 & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar33 = (auVar59 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar32 = (auVar59 >> 0x27 & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar31 = (auVar59 >> 0x2f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar30 = (auVar59 >> 0x37 & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar29 = (auVar59 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar28 = (auVar59 >> 0x47 & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar27 = (auVar59 >> 0x4f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar26 = (auVar59 >> 0x57 & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar25 = (auVar59 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar24 = (auVar59 >> 0x67 & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar23 = (auVar59 >> 0x6f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar22 = (auVar59 >> 0x77 & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar21 = SUB321(auVar59 >> 0x7f,0) == '\0';
  bVar20 = (auVar59 >> 0x87 & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar19 = (auVar59 >> 0x8f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar18 = (auVar59 >> 0x97 & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar17 = (auVar59 >> 0x9f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar16 = (auVar59 >> 0xa7 & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar15 = (auVar59 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar14 = (auVar59 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar13 = SUB321(auVar59 >> 0xbf,0) == '\0';
  bVar12 = (auVar59 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar11 = (auVar59 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar10 = (auVar59 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar9 = (auVar59 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar8 = (auVar59 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar7 = (auVar59 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar6 = (auVar59 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar44 = -1 < auVar59[0x1f];
  if (((((((((((((((((((((((((((((((bVar35 && bVar36) && bVar34) && bVar33) && bVar32) && bVar31) &&
                              bVar30) && bVar29) && bVar28) && bVar27) && bVar26) && bVar25) &&
                        bVar24) && bVar23) && bVar22) && bVar21) && bVar20) && bVar19) && bVar18) &&
                 bVar17) && bVar16) && bVar15) && bVar14) && bVar13) && bVar12) && bVar11) && bVar10
          ) && bVar9) && bVar8) && bVar7) && bVar6) && bVar44) {
    local_f8 = vpshufd_avx2(auVar3,0xee);
    auVar58 = vpshufd_avx2(auVar65,0xee);
    auVar3 = vpshufd_avx2(auVar56,0xee);
    auVar59 = vpshufd_avx2(auVar4,0xee);
    auVar51 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    *(undefined1 (*) [32])(qcoeff_ptr + 8) = auVar51;
    *(undefined1 (*) [32])qcoeff_ptr = auVar51;
    auVar62 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    auVar49 = ZEXT1664((undefined1  [16])0x0);
  }
  else {
    auVar59 = vpermq_avx2(auVar59,0xd8);
    auVar59 = vpand_avx2(auVar59,*(undefined1 (*) [32])iscan);
    auVar59 = vpmaxsw_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar59);
    auVar49 = ZEXT3264(auVar59);
    auVar51 = vpaddd_avx2(auVar3,auVar51);
    auVar59 = vpmuldq_avx2(auVar51,auVar65);
    auVar58 = vpsrlq_avx2(auVar51,0x20);
    auVar61 = vpsrlq_avx2(auVar65,0x20);
    auVar58 = vpmuldq_avx2(auVar58,auVar61);
    auVar61 = vpsrlq_avx2(auVar59,0x10);
    auVar59 = vpsllq_avx2(auVar58,0x10);
    auVar59 = vpblendd_avx2(auVar61,auVar59,0xaa);
    auVar51 = vpaddd_avx2(auVar59,auVar51);
    auVar59 = vpmuldq_avx2(auVar51,auVar56);
    auVar51 = vpsrlq_avx2(auVar51,0x20);
    auVar58 = vpsrlq_avx2(auVar56,0x20);
    auVar51 = vpmuldq_avx2(auVar51,auVar58);
    auVar59 = vpsrlq_avx2(auVar59,0x10);
    auVar51 = vpsllq_avx2(auVar51,0x10);
    auVar61 = vpblendd_avx2(auVar59,auVar51,0xaa);
    local_f8 = vpshufd_avx2(auVar3,0xee);
    auVar58 = vpshufd_avx2(auVar65,0xee);
    auVar3 = vpshufd_avx2(auVar56,0xee);
    auVar51 = vpaddd_avx2(auVar62,local_f8);
    auVar62 = vpmuldq_avx2(auVar51,auVar58);
    auVar59 = vpsrlq_avx2(auVar51,0x20);
    auVar65 = vpsrlq_avx2(auVar58,0x20);
    auVar59 = vpmuldq_avx2(auVar59,auVar65);
    auVar62 = vpsrlq_avx2(auVar62,0x10);
    auVar59 = vpsllq_avx2(auVar59,0x10);
    auVar62 = vpblendd_avx2(auVar62,auVar59,0xaa);
    auVar51 = vpaddd_avx2(auVar62,auVar51);
    auVar62 = vpmuldq_avx2(auVar51,auVar3);
    auVar51 = vpsrlq_avx2(auVar51,0x20);
    auVar59 = vpsrlq_avx2(auVar3,0x20);
    auVar51 = vpmuldq_avx2(auVar51,auVar59);
    auVar62 = vpsrlq_avx2(auVar62,0x10);
    auVar51 = vpsllq_avx2(auVar51,0x10);
    auVar62 = vpblendd_avx2(auVar62,auVar51,0xaa);
    auVar51 = vpsignd_avx2(auVar61,*(undefined1 (*) [32])coeff_ptr);
    auVar62 = vpsignd_avx2(auVar62,*(undefined1 (*) [32])(coeff_ptr + 8));
    auVar51 = vpandn_avx2(auVar64,auVar51);
    auVar62 = vpand_avx2(auVar52,auVar62);
    *(undefined1 (*) [32])qcoeff_ptr = auVar51;
    *(undefined1 (*) [32])(qcoeff_ptr + 8) = auVar62;
    auVar51 = vpmulld_avx2(auVar51,auVar4);
    auVar59 = vpshufd_avx2(auVar4,0xee);
    auVar62 = vpmulld_avx2(auVar62,auVar59);
    auVar61 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
  }
  bVar44 = ((((((((((((((((((((((((((((((!bVar35 || !bVar36) || !bVar34) || !bVar33) || !bVar32) ||
                                    !bVar31) || !bVar30) || !bVar29) || !bVar28) || !bVar27) ||
                               !bVar26) || !bVar25) || !bVar24) || !bVar23) || !bVar22) || !bVar21)
                         || !bVar20) || !bVar19) || !bVar18) || !bVar17) || !bVar16) || !bVar15) ||
                   !bVar14) || !bVar13) || !bVar12) || !bVar11) || !bVar10) || !bVar9) || !bVar8) ||
            !bVar7) || !bVar6) || !bVar44;
  auVar64 = auVar49._0_32_;
  auVar52 = vpmaxsw_avx2(auVar55,auVar61);
  auVar60 = ZEXT3264(auVar52);
  *(undefined1 (*) [32])dqcoeff_ptr = auVar51;
  *(undefined1 (*) [32])(dqcoeff_ptr + 8) = auVar62;
  if (0x10 < n_coeffs) {
    auVar62 = vpsrad_avx2(auVar58,0x1f);
    auVar51 = vpshufd_avx2(auVar58,0xf5);
    auVar62 = vpblendd_avx2(auVar51,auVar62,0xaa);
    auVar52 = vpsrad_avx2(auVar3,0x1f);
    auVar51 = vpshufd_avx2(auVar3,0xf5);
    auVar51 = vpblendd_avx2(auVar51,auVar52,0xaa);
    iVar43 = 0x10;
    lVar47 = 0x10;
    bVar6 = bVar44;
    do {
      bVar44 = bVar6;
      lVar45 = (long)iVar43;
      while( true ) {
        iVar43 = iVar43 + 0x10;
        auVar55 = vpabsd_avx2(*(undefined1 (*) [32])(coeff_ptr + lVar47));
        auVar61 = vpabsd_avx2(*(undefined1 (*) [32])(coeff_ptr + lVar47 + 8));
        auVar52 = vpslld_avx2(auVar55,5);
        auVar52 = vpcmpgtd_avx2(auVar52,auVar48);
        auVar64 = vpslld_avx2(auVar61,5);
        auVar64 = vpcmpgtd_avx2(auVar64,auVar48);
        auVar52 = vpackssdw_avx2(auVar52,auVar64);
        if ((((((((((((((((((((((((((((((((auVar52 >> 7 & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0 &&
                                         (auVar52 >> 0xf & (undefined1  [32])0x1) ==
                                         (undefined1  [32])0x0) &&
                                        (auVar52 >> 0x17 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) &&
                                       (auVar52 >> 0x1f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (auVar52 >> 0x27 & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) &&
                                     (auVar52 >> 0x2f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar52 >> 0x37 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                   (auVar52 >> 0x3f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar52 >> 0x47 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                  ) && (auVar52 >> 0x4f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                (auVar52 >> 0x57 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && (auVar52 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (auVar52 >> 0x67 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                             (auVar52 >> 0x6f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar52 >> 0x77 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar52 >> 0x7f,0) == '\0') &&
                          (auVar52 >> 0x87 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         (auVar52 >> 0x8f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar52 >> 0x97 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar52 >> 0x9f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar52 >> 0xa7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (auVar52 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar52 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar52 >> 0xbf,0) == '\0') &&
                  (auVar52 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 (auVar52 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar52 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               (auVar52 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar52 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             (auVar52 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar52 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            -1 < auVar52[0x1f]) {
          auVar52 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        }
        else {
          auVar52 = vpermq_avx2(auVar52,0xd8);
          auVar52 = vpand_avx2(auVar52,*(undefined1 (*) [32])(iscan + lVar47));
          bVar37 = true;
        }
        auVar52 = vpmaxsw_avx2(auVar52,auVar60._0_32_);
        auVar60 = ZEXT3264(auVar52);
        auVar65 = vpcmpgtd_avx2(auVar55,auVar5);
        auVar4 = vpcmpgtd_avx2(auVar61,auVar5);
        auVar64 = vpackssdw_avx2(auVar65,auVar4);
        if ((((((((((((((((((((((((((((((((auVar64 >> 7 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0 ||
                                         (auVar64 >> 0xf & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar64 >> 0x17 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar64 >> 0x1f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar64 >> 0x27 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar64 >> 0x2f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar64 >> 0x37 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar64 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar64 >> 0x47 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar64 >> 0x4f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar64 >> 0x57 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar64 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar64 >> 0x67 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                             (auVar64 >> 0x6f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar64 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar64 >> 0x7f,0) != '\0') ||
                          (auVar64 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar64 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar64 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar64 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar64 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar64 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar64 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar64 >> 0xbf,0) != '\0') ||
                  (auVar64 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (auVar64 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar64 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (auVar64 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar64 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             (auVar64 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar64 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            auVar64[0x1f] < '\0') break;
        auVar55 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        auVar64 = vpmaxsw_avx2(auVar55,auVar49._0_32_);
        auVar49 = ZEXT3264(auVar64);
        *(undefined1 (*) [32])(qcoeff_ptr + lVar47 + 8) = auVar55;
        *(undefined1 (*) [32])(qcoeff_ptr + lVar47) = auVar55;
        lVar45 = lVar45 + 0x10;
        *(undefined1 (*) [32])(dqcoeff_ptr + lVar47 + 8) = auVar55;
        *(undefined1 (*) [32])(dqcoeff_ptr + lVar47) = auVar55;
        lVar47 = lVar45;
        if (n_coeffs <= lVar45) goto LAB_0037f726;
      }
      auVar64 = vpermq_avx2(auVar64,0xd8);
      auVar64 = vpand_avx2(auVar64,*(undefined1 (*) [32])(iscan + lVar47));
      auVar64 = vpmaxsw_avx2(auVar64,auVar49._0_32_);
      auVar49 = ZEXT3264(auVar64);
      auVar55 = vpaddd_avx2(auVar55,local_f8);
      auVar57 = vpmuldq_avx2(auVar55,auVar58);
      auVar63 = vpsrad_avx2(auVar55,0x1f);
      auVar54 = vpshufd_avx2(auVar55,0xf5);
      auVar53 = vpsrlq_avx2(auVar62,0x20);
      auVar56 = vpmuludq_avx2(auVar54,auVar53);
      auVar63 = vpsrlq_avx2(auVar63,0x20);
      auVar63 = vpmuludq_avx2(auVar63,auVar62);
      auVar56 = vpaddq_avx2(auVar63,auVar56);
      auVar63 = vpsllq_avx2(auVar56,0x20);
      auVar56 = vpmuludq_avx2(auVar62,auVar54);
      auVar56 = vpaddq_avx2(auVar56,auVar63);
      auVar57 = vpsrlq_avx2(auVar57,0x10);
      auVar56 = vpsllq_avx2(auVar56,0x10);
      auVar56 = vpblendd_avx2(auVar57,auVar56,0xaa);
      auVar55 = vpaddd_avx2(auVar56,auVar55);
      auVar57 = vpsrad_avx2(auVar55,0x1f);
      auVar63 = vpshufd_avx2(auVar55,0xf5);
      auVar54 = vpsrlq_avx2(auVar51,0x20);
      auVar56 = vpmuludq_avx2(auVar63,auVar54);
      auVar57 = vpsrlq_avx2(auVar57,0x20);
      auVar57 = vpmuludq_avx2(auVar51,auVar57);
      auVar56 = vpaddq_avx2(auVar56,auVar57);
      auVar57 = vpmuldq_avx2(auVar55,auVar3);
      auVar56 = vpsllq_avx2(auVar56,0x20);
      auVar55 = vpmuludq_avx2(auVar51,auVar63);
      auVar55 = vpaddq_avx2(auVar55,auVar56);
      auVar56 = vpsrlq_avx2(auVar57,0x10);
      auVar55 = vpsllq_avx2(auVar55,0x10);
      auVar63 = vpblendd_avx2(auVar56,auVar55,0xaa);
      auVar55 = vpaddd_avx2(auVar61,local_f8);
      auVar56 = vpsrad_avx2(auVar55,0x1f);
      auVar57 = vpshufd_avx2(auVar55,0xf5);
      auVar61 = vpmuludq_avx2(auVar57,auVar53);
      auVar56 = vpsrlq_avx2(auVar56,0x20);
      auVar56 = vpmuludq_avx2(auVar62,auVar56);
      auVar61 = vpaddq_avx2(auVar61,auVar56);
      auVar56 = vpsllq_avx2(auVar61,0x20);
      auVar61 = vpmuludq_avx2(auVar57,auVar62);
      auVar61 = vpaddq_avx2(auVar61,auVar56);
      auVar56 = vpmuldq_avx2(auVar55,auVar58);
      auVar56 = vpsrlq_avx2(auVar56,0x10);
      auVar61 = vpsllq_avx2(auVar61,0x10);
      auVar61 = vpblendd_avx2(auVar56,auVar61,0xaa);
      auVar55 = vpaddd_avx2(auVar61,auVar55);
      auVar56 = vpsrad_avx2(auVar55,0x1f);
      auVar57 = vpshufd_avx2(auVar55,0xf5);
      auVar61 = vpmuludq_avx2(auVar57,auVar54);
      auVar56 = vpsrlq_avx2(auVar56,0x20);
      auVar56 = vpmuludq_avx2(auVar51,auVar56);
      auVar61 = vpaddq_avx2(auVar61,auVar56);
      auVar56 = vpsllq_avx2(auVar61,0x20);
      auVar61 = vpmuludq_avx2(auVar51,auVar57);
      auVar61 = vpaddq_avx2(auVar61,auVar56);
      auVar55 = vpmuldq_avx2(auVar55,auVar3);
      auVar55 = vpsrlq_avx2(auVar55,0x10);
      auVar61 = vpsllq_avx2(auVar61,0x10);
      auVar61 = vpblendd_avx2(auVar55,auVar61,0xaa);
      auVar55 = vpsignd_avx2(auVar63,*(undefined1 (*) [32])(coeff_ptr + lVar47));
      auVar61 = vpsignd_avx2(auVar61,*(undefined1 (*) [32])(coeff_ptr + lVar47 + 8));
      auVar55 = vpand_avx2(auVar65,auVar55);
      auVar61 = vpand_avx2(auVar4,auVar61);
      *(undefined1 (*) [32])(qcoeff_ptr + lVar47) = auVar55;
      *(undefined1 (*) [32])(qcoeff_ptr + lVar47 + 8) = auVar61;
      auVar55 = vpmulld_avx2(auVar55,auVar59);
      *(undefined1 (*) [32])(dqcoeff_ptr + lVar47) = auVar55;
      auVar55 = vpmulld_avx2(auVar61,auVar59);
      *(undefined1 (*) [32])(dqcoeff_ptr + lVar47 + 8) = auVar55;
      lVar47 = (long)iVar43;
      bVar44 = true;
      bVar6 = true;
    } while (lVar47 < n_coeffs);
  }
LAB_0037f726:
  if (bVar37) {
    auVar2 = vpmaxsw_avx(auVar52._0_16_,auVar52._16_16_);
    auVar50 = vpshufd_avx(auVar2,0xee);
    auVar2 = vpmaxsw_avx(auVar50,auVar2);
    auVar50 = vpshufd_avx(auVar2,1);
    auVar2 = vpmaxsw_avx(auVar50,auVar2);
    auVar50 = vpsrld_avx(auVar2,0x10);
    auVar2 = vpmaxsw_avx(auVar2,auVar50);
    iVar43 = vpextrw_avx(auVar2,0);
    uVar42 = iVar43 + 1;
  }
  else {
    uVar42 = 0;
  }
  if (bVar44) {
    auVar2 = vpmaxsw_avx(auVar64._0_16_,auVar64._16_16_);
    auVar50 = vpshufd_avx(auVar2,0xee);
    auVar2 = vpmaxsw_avx(auVar50,auVar2);
    auVar50 = vpshufd_avx(auVar2,1);
    auVar2 = vpmaxsw_avx(auVar50,auVar2);
    auVar50 = vpsrld_avx(auVar2,0x10);
    auVar2 = vpmaxsw_avx(auVar2,auVar50);
    uVar41 = vpextrw_avx(auVar2,0);
  }
  else {
    uVar41 = 0xffffffff;
  }
  if ((int)uVar42 <= (int)uVar41) {
    iVar43 = uVar41 + 1;
    psVar38 = scan + uVar41;
    do {
      sVar1 = *psVar38;
      qcoeff_ptr[sVar1] = 0;
      dqcoeff_ptr[sVar1] = 0;
      iVar43 = iVar43 + -1;
      psVar38 = psVar38 + -1;
    } while ((int)uVar42 < iVar43);
  }
  iVar43 = uVar42 + 1;
  uVar39 = (ulong)uVar42;
  do {
    if ((long)uVar39 < 1) {
      uVar40 = 0;
      break;
    }
    lVar47 = uVar39 - 1;
    uVar39 = uVar39 - 1;
    iVar43 = iVar43 + -1;
    uVar40 = (ushort)iVar43;
  } while (qcoeff_ptr[scan[lVar47]] == 0);
  *eob_ptr = uVar40;
  uVar41 = 0xffffffff;
  if (uVar42 != 0) {
    uVar39 = 0;
    do {
      if (qcoeff_ptr[scan[uVar39]] != 0) {
        uVar41 = (uint)uVar39;
        break;
      }
      uVar39 = uVar39 + 1;
    } while (uVar42 != uVar39);
  }
  if ((uVar40 != 0) && (uVar41 == uVar40 - 1)) {
    sVar1 = scan[uVar41];
    if (((qcoeff_ptr[sVar1] == 1) || (qcoeff_ptr[sVar1] == -1)) &&
       (uVar42 = coeff_ptr[sVar1] >> 0x1f, uVar39 = (ulong)((uint)(sVar1 != 0) * 2),
       (int)((coeff_ptr[sVar1] << 5 ^ uVar42) - uVar42) <
       *(short *)((long)zbin_ptr + uVar39) * 0x20 +
       (*(short *)((long)dequant_ptr + uVar39) * 0x20d + 0x40 >> 7))) {
      qcoeff_ptr[sVar1] = 0;
      dqcoeff_ptr[sVar1] = 0;
      *eob_ptr = 0;
    }
  }
  return;
}

Assistant:

void aom_highbd_quantize_b_adaptive_avx2(
    const tran_low_t *coeff_ptr, intptr_t n_coeffs, const int16_t *zbin_ptr,
    const int16_t *round_ptr, const int16_t *quant_ptr,
    const int16_t *quant_shift_ptr, tran_low_t *qcoeff_ptr,
    tran_low_t *dqcoeff_ptr, const int16_t *dequant_ptr, uint16_t *eob_ptr,
    const int16_t *scan, const int16_t *iscan) {
  int index = 16;
  int non_zero_count = 0;
  int non_zero_count_prescan_add_zero = 0;
  int is_found0 = 0, is_found1 = 0;
  int eob = -1;
  const __m256i zero = _mm256_setzero_si256();
  __m256i zbin, round, quant, dequant, shift;
  __m256i coeff0, qcoeff0, coeff1, qcoeff1;
  __m256i cmp_mask, mask0 = zero, mask1 = zero;
  __m128i temp_mask0, temp_mask1;
  int prescan_add[2];
  int thresh[2];
  const int log_scale = 0;
  const qm_val_t wt = (1 << AOM_QM_BITS);
  for (int i = 0; i < 2; ++i) {
    prescan_add[i] = ROUND_POWER_OF_TWO(dequant_ptr[i] * EOB_FACTOR, 7);
    thresh[i] = (zbin_ptr[i] * wt + prescan_add[i]) - 1;
  }
  __m256i threshold[2];
  threshold[0] = _mm256_set1_epi32(thresh[0]);
  threshold[1] = _mm256_set1_epi32(thresh[1]);
  threshold[0] = _mm256_blend_epi32(threshold[0], threshold[1], 0xfe);

#if SKIP_EOB_FACTOR_ADJUST
  int first = -1;
#endif

  // Setup global values.
  highbd_load_b_values_avx2(zbin_ptr, &zbin, round_ptr, &round, quant_ptr,
                            &quant, dequant_ptr, &dequant, quant_shift_ptr,
                            &shift);

  // Do DC and first 15 AC.
  coeff0 = _mm256_load_si256((__m256i *)(coeff_ptr));
  qcoeff0 = _mm256_abs_epi32(coeff0);
  coeff1 = _mm256_load_si256((__m256i *)(coeff_ptr + 8));
  qcoeff1 = _mm256_abs_epi32(coeff1);
  highbd_update_mask0_avx2(&qcoeff0, &qcoeff1, threshold, iscan, &is_found0,
                           &mask0);
  __m256i temp0 = _mm256_cmpgt_epi32(qcoeff0, zbin);
  zbin = _mm256_unpackhi_epi64(zbin, zbin);
  __m256i temp1 = _mm256_cmpgt_epi32(qcoeff1, zbin);
  cmp_mask = _mm256_permute4x64_epi64(_mm256_packs_epi32(temp0, temp1), 0xd8);
  highbd_update_mask1_avx2(&cmp_mask, iscan, &is_found1, &mask1);
  threshold[0] = threshold[1];
  if (_mm256_movemask_epi8(cmp_mask) == 0) {
    _mm256_store_si256((__m256i *)(qcoeff_ptr), zero);
    _mm256_store_si256((__m256i *)(qcoeff_ptr + 8), zero);
    _mm256_store_si256((__m256i *)(dqcoeff_ptr), zero);
    _mm256_store_si256((__m256i *)(dqcoeff_ptr + 8), zero);
    round = _mm256_unpackhi_epi64(round, round);
    quant = _mm256_unpackhi_epi64(quant, quant);
    shift = _mm256_unpackhi_epi64(shift, shift);
    dequant = _mm256_unpackhi_epi64(dequant, dequant);
  } else {
    highbd_calculate_qcoeff_avx2(&qcoeff0, &round, &quant, &shift, &log_scale);
    round = _mm256_unpackhi_epi64(round, round);
    quant = _mm256_unpackhi_epi64(quant, quant);
    shift = _mm256_unpackhi_epi64(shift, shift);
    highbd_calculate_qcoeff_avx2(&qcoeff1, &round, &quant, &shift, &log_scale);
    // Reinsert signs
    qcoeff0 = _mm256_sign_epi32(qcoeff0, coeff0);
    qcoeff1 = _mm256_sign_epi32(qcoeff1, coeff1);
    // Mask out zbin threshold coeffs
    qcoeff0 = _mm256_and_si256(qcoeff0, temp0);
    qcoeff1 = _mm256_and_si256(qcoeff1, temp1);
    highbd_store_coefficients_avx2(qcoeff0, qcoeff1, qcoeff_ptr);
    coeff0 = highbd_calculate_dqcoeff_avx2(qcoeff0, dequant);
    dequant = _mm256_unpackhi_epi64(dequant, dequant);
    coeff1 = highbd_calculate_dqcoeff_avx2(qcoeff1, dequant);
    highbd_store_coefficients_avx2(coeff0, coeff1, dqcoeff_ptr);
  }

  // AC only loop.
  while (index < n_coeffs) {
    coeff0 = _mm256_load_si256((__m256i *)(coeff_ptr + index));
    qcoeff0 = _mm256_abs_epi32(coeff0);
    coeff1 = _mm256_load_si256((__m256i *)(coeff_ptr + index + 8));
    qcoeff1 = _mm256_abs_epi32(coeff1);
    highbd_update_mask0_avx2(&qcoeff0, &qcoeff1, threshold, iscan + index,
                             &is_found0, &mask0);
    temp0 = _mm256_cmpgt_epi32(qcoeff0, zbin);
    temp1 = _mm256_cmpgt_epi32(qcoeff1, zbin);
    cmp_mask = _mm256_permute4x64_epi64(_mm256_packs_epi32(temp0, temp1), 0xd8);
    highbd_update_mask1_avx2(&cmp_mask, iscan + index, &is_found1, &mask1);
    if (_mm256_movemask_epi8(cmp_mask) == 0) {
      _mm256_store_si256((__m256i *)(qcoeff_ptr + index), zero);
      _mm256_store_si256((__m256i *)(qcoeff_ptr + index + 8), zero);
      _mm256_store_si256((__m256i *)(dqcoeff_ptr + index), zero);
      _mm256_store_si256((__m256i *)(dqcoeff_ptr + index + 8), zero);
      index += 16;
      continue;
    }
    highbd_calculate_qcoeff_avx2(&qcoeff0, &round, &quant, &shift, &log_scale);
    highbd_calculate_qcoeff_avx2(&qcoeff1, &round, &quant, &shift, &log_scale);
    qcoeff0 = _mm256_sign_epi32(qcoeff0, coeff0);
    qcoeff1 = _mm256_sign_epi32(qcoeff1, coeff1);
    qcoeff0 = _mm256_and_si256(qcoeff0, temp0);
    qcoeff1 = _mm256_and_si256(qcoeff1, temp1);
    highbd_store_coefficients_avx2(qcoeff0, qcoeff1, qcoeff_ptr + index);
    coeff0 = highbd_calculate_dqcoeff_avx2(qcoeff0, dequant);
    coeff1 = highbd_calculate_dqcoeff_avx2(qcoeff1, dequant);
    highbd_store_coefficients_avx2(coeff0, coeff1, dqcoeff_ptr + index);
    index += 16;
  }
  if (is_found0) {
    temp_mask0 = _mm_max_epi16(_mm256_castsi256_si128(mask0),
                               _mm256_extracti128_si256(mask0, 1));
    non_zero_count = calculate_non_zero_count(temp_mask0);
  }
  if (is_found1) {
    temp_mask1 = _mm_max_epi16(_mm256_castsi256_si128(mask1),
                               _mm256_extracti128_si256(mask1, 1));
    non_zero_count_prescan_add_zero = calculate_non_zero_count(temp_mask1);
  }

  for (int i = non_zero_count_prescan_add_zero - 1; i >= non_zero_count; i--) {
    const int rc = scan[i];
    qcoeff_ptr[rc] = 0;
    dqcoeff_ptr[rc] = 0;
  }

  for (int i = non_zero_count - 1; i >= 0; i--) {
    const int rc = scan[i];
    if (qcoeff_ptr[rc]) {
      eob = i;
      break;
    }
  }

  *eob_ptr = eob + 1;
#if SKIP_EOB_FACTOR_ADJUST
  // TODO(Aniket): Experiment the following loop with intrinsic by combining
  // with the quantization loop above
  for (int i = 0; i < non_zero_count; i++) {
    const int rc = scan[i];
    const int qcoeff = qcoeff_ptr[rc];
    if (qcoeff) {
      first = i;
      break;
    }
  }
  if ((*eob_ptr - 1) >= 0 && first == (*eob_ptr - 1)) {
    const int rc = scan[(*eob_ptr - 1)];
    if (qcoeff_ptr[rc] == 1 || qcoeff_ptr[rc] == -1) {
      const int coeff = coeff_ptr[rc] * wt;
      const int coeff_sign = AOMSIGN(coeff);
      const int abs_coeff = (coeff ^ coeff_sign) - coeff_sign;
      const int factor = EOB_FACTOR + SKIP_EOB_FACTOR_ADJUST;
      const int prescan_add_val =
          ROUND_POWER_OF_TWO(dequant_ptr[rc != 0] * factor, 7);
      if (abs_coeff <
          (zbin_ptr[rc != 0] * (1 << AOM_QM_BITS) + prescan_add_val)) {
        qcoeff_ptr[rc] = 0;
        dqcoeff_ptr[rc] = 0;
        *eob_ptr = 0;
      }
    }
  }
#endif
}